

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O0

void mxx::allgather<unsigned_int>(uint *data,size_t size,uint *out,comm *comm)

{
  int iVar1;
  MPI_Datatype poVar2;
  MPI_Datatype poVar3;
  MPI_Comm poVar4;
  undefined1 local_40 [8];
  datatype dt;
  comm *comm_local;
  uint *out_local;
  size_t size_local;
  uint *data_local;
  
  dt._16_8_ = comm;
  iVar1 = mxx::comm::size(comm);
  if (size * (long)iVar1 < 0x7fffffff) {
    get_datatype<unsigned_int>();
    poVar2 = datatype::type((datatype *)local_40);
    poVar3 = datatype::type((datatype *)local_40);
    poVar4 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Allgather(data,size & 0xffffffff,poVar2,out,size & 0xffffffff,poVar3,poVar4);
    datatype::~datatype((datatype *)local_40);
  }
  else {
    impl::allgather_big<unsigned_int>(data,size,out,(comm *)dt._16_8_);
  }
  return;
}

Assistant:

void allgather(const T* data, size_t size, T* out, const mxx::comm& comm = mxx::comm()) {
    if (size*comm.size() >= mxx::max_int) {
        // use custom implementation for big data
        impl::allgather_big(data, size, out, comm);
    } else {
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Allgather(const_cast<T*>(data), size, dt.type(), out, size, dt.type(), comm);
    }
}